

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall
embree::TutorialBuildBenchmark::registerBuildBenchmark
          (TutorialBuildBenchmark *this,string *name,BuildBenchType buildBenchType,int argc,
          char **argv)

{
  BuildBenchType BVar1;
  ostream *poVar2;
  char *pcVar3;
  BenchState benchState;
  BuildBenchParams p;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BVar1 = (this->buildParams).buildBenchType;
  if ((BVar1 & buildBenchType) == 0) {
    return;
  }
  if ((BVar1 & BVar1 - UPDATE_DYNAMIC_DEFORMABLE) == 0) goto LAB_0021b33b;
  switch(buildBenchType) {
  case UPDATE_DYNAMIC_DEFORMABLE:
    pcVar3 = "update_dynamic_deformable";
    break;
  case UPDATE_DYNAMIC_DYNAMIC:
    pcVar3 = "update_dynamic_dynamic";
    break;
  case UPDATE_DYNAMIC_DYNAMIC|UPDATE_DYNAMIC_DEFORMABLE:
  case UPDATE_DYNAMIC_STATIC|UPDATE_DYNAMIC_DEFORMABLE:
  case UPDATE_DYNAMIC_STATIC|UPDATE_DYNAMIC_DYNAMIC:
  case UPDATE_DYNAMIC_STATIC|UPDATE_DYNAMIC_DYNAMIC|UPDATE_DYNAMIC_DEFORMABLE:
switchD_0021b2a4_caseD_3:
    pcVar3 = "all";
    break;
  case UPDATE_DYNAMIC_STATIC:
    pcVar3 = "update_dynamic_static";
    break;
  case CREATE_DYNAMIC_DEFORMABLE:
    pcVar3 = "create_dynamic_deformable";
    break;
  default:
    if (buildBenchType == CREATE_DYNAMIC_DYNAMIC) {
      pcVar3 = "create_dynamic_dynamic";
    }
    else if (buildBenchType == CREATE_DYNAMIC_STATIC) {
      pcVar3 = "create_dynamic_static";
    }
    else if (buildBenchType == CREATE_STATIC_STATIC) {
      pcVar3 = "create_static_static";
    }
    else if (buildBenchType == CREATE_HIGH_QUALITY_STATIC_STATIC) {
      pcVar3 = "create_high_quality_static_static";
    }
    else {
      if (buildBenchType != CREATE_USER_THREADS_STATIC_STATIC) goto switchD_0021b2a4_caseD_3;
      pcVar3 = "create_user_threads_static_static";
    }
  }
  std::__cxx11::string::string((string *)&local_70,pcVar3,&local_71);
  std::operator+(&local_50,"_",&local_70);
  std::__cxx11::string::append((string *)name);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
LAB_0021b33b:
  local_50._M_dataplus._M_p._4_4_ = (this->buildParams).userThreads;
  local_50._M_dataplus._M_p._0_4_ = buildBenchType;
  poVar2 = std::operator<<((ostream *)&std::cout,"BENCHMARK SCENE: ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar2);
  (*this->buildBenchFunc)
            ((BenchState *)&local_70,&(this->super_TutorialBenchmark).params,
             (BuildBenchParams *)&local_50,argc,argv);
  return;
}

Assistant:

void TutorialBuildBenchmark::registerBuildBenchmark(std::string name, BuildBenchType buildBenchType, int argc, char** argv)
{
  if (buildParams.buildBenchType & buildBenchType) {
    // attach benchmark name if more than one bit in buildBenchMask is set
    bool attach = (buildParams.buildBenchType & (buildParams.buildBenchType - 1)) != 0;
    if (attach) name += "_" + getBuildBenchTypeString(buildBenchType);
    BuildBenchParams p = buildParams;
    p.buildBenchType = buildBenchType;
#ifdef USE_GOOGLE_BENCHMARK
    if (params.legacy) {
      std::cout << "BENCHMARK SCENE: " << name << std::endl;
      BenchState benchState;
      buildBenchFunc(benchState, params, p, argc, argv);
    }
    else {
      ::benchmark::RegisterBenchmark(name.c_str(), callBuildBenchFunc, argc, argv, params, p, buildBenchFunc)->Unit(::benchmark::TimeUnit::kMillisecond);
    }
#else
    std::cout << "BENCHMARK SCENE: " << name << std::endl;
    BenchState benchState;
    buildBenchFunc(benchState, params, p, argc, argv);
#endif
  }
}